

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_aggregate_functions.cpp
# Opt level: O0

void RepeatedStringAggFinalize
               (duckdb_function_info info,duckdb_aggregate_state *source_p,duckdb_vector result,
               idx_t count,idx_t offset)

{
  undefined8 uVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_R8;
  idx_t i;
  uint64_t *result_validity;
  RepeatedStringAggState **source;
  undefined8 local_40;
  
  duckdb_vector_ensure_validity_writable(in_RDX);
  uVar1 = duckdb_vector_get_validity(in_RDX);
  for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
    if (**(long **)(in_RSI + local_40 * 8) == 0) {
      duckdb_validity_set_row_invalid(uVar1,in_R8 + local_40);
    }
    else {
      duckdb_vector_assign_string_element_len
                (in_RDX,in_R8 + local_40,**(undefined8 **)(in_RSI + local_40 * 8),
                 *(undefined8 *)(*(long *)(in_RSI + local_40 * 8) + 8));
    }
  }
  return;
}

Assistant:

void RepeatedStringAggFinalize(duckdb_function_info info, duckdb_aggregate_state *source_p, duckdb_vector result,
                               idx_t count, idx_t offset) {
	auto source = reinterpret_cast<RepeatedStringAggState **>(source_p);
	duckdb_vector_ensure_validity_writable(result);
	auto result_validity = duckdb_vector_get_validity(result);

	for (idx_t i = 0; i < count; i++) {
		if (!source[i]->data) {
			duckdb_validity_set_row_invalid(result_validity, offset + i);
		} else {
			duckdb_vector_assign_string_element_len(result, offset + i, reinterpret_cast<const char *>(source[i]->data),
			                                        source[i]->size);
		}
	}
}